

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O0

bool __thiscall el::base::LogFormat::operator==(LogFormat *this,LogFormat *other)

{
  __type _Var1;
  bool local_19;
  LogFormat *other_local;
  LogFormat *this_local;
  
  local_19 = false;
  if (this->m_level == other->m_level) {
    _Var1 = std::operator==(&this->m_userFormat,&other->m_userFormat);
    local_19 = false;
    if (_Var1) {
      _Var1 = std::operator==(&this->m_format,&other->m_format);
      local_19 = false;
      if (_Var1) {
        _Var1 = std::operator==(&this->m_dateTimeFormat,&other->m_dateTimeFormat);
        local_19 = false;
        if (_Var1) {
          local_19 = this->m_flags == other->m_flags;
        }
      }
    }
  }
  return local_19;
}

Assistant:

bool LogFormat::operator==(const LogFormat& other) {
  return m_level == other.m_level && m_userFormat == other.m_userFormat && m_format == other.m_format &&
         m_dateTimeFormat == other.m_dateTimeFormat && m_flags == other.m_flags;
}